

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_map.hpp
# Opt level: O0

ostream * operator<<(ostream *out,
                    skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
                    *sl)

{
  bool bVar1;
  reference ppSVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  reference pbVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  reference ppSVar6;
  reverse_iterator<__gnu_cxx::__normal_iterator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*const_*,_std::vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>_>_>
  local_e8;
  int local_e0;
  int local_dc;
  int i_1;
  int local_d4;
  SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSStack_d0;
  int i;
  SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *it;
  int next_index;
  int index;
  const_reverse_iterator end;
  const_reverse_iterator level;
  string local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  iterator __end0;
  iterator __begin0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  const_iterator cStack_60;
  int cur_index;
  SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *bottom_it;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> index_store;
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  *sl_local;
  ostream *out_local;
  
  index_store._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)sl;
  bVar1 = std::
          vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
          ::empty(&sl->key);
  if (bVar1) {
    poVar4 = std::operator<<(out,"EMPTY SKIPLIST");
    out_local = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::operator<<(out,"Values: ");
    memset(&bottom_it,0,0x30);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &bottom_it);
    cStack_60 = std::
                vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                ::begin((vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                         *)index_store._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ppSVar2 = __gnu_cxx::
              __normal_iterator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*const_*,_std::vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>_>
              ::operator*(&stack0xffffffffffffffa0);
    local_58 = (*ppSVar2)->next;
    __range2._4_4_ = 0;
    for (; local_58 !=
           (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0; local_58 = local_58->next) {
      this = &local_58->valz;
      __end0 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this);
      local_80._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&__end0,&local_80);
        if (!bVar1) break;
        pbVar3 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end0);
        std::__cxx11::string::string(local_a0,(string *)pbVar3);
        poVar4 = std::operator<<(out,local_a0);
        std::operator<<(poVar4,", ");
        std::__cxx11::string::~string(local_a0);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end0);
      }
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&bottom_it,&local_58->val);
      *pmVar5 = __range2._4_4_;
      __range2._4_4_ = __range2._4_4_ + 1;
    }
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    std::
    vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
    ::rbegin((vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
              *)&end);
    std::
    vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
    ::rend((vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
            *)&next_index);
    while( true ) {
      bVar1 = std::operator!=(&end,(reverse_iterator<__gnu_cxx::__normal_iterator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*const_*,_std::vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>_>_>
                                    *)&next_index);
      if (!bVar1) break;
      std::operator<<(out,"S");
      it._4_4_ = -1;
      ppSVar6 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*const_*,_std::vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>_>_>
                ::operator*(&end);
      for (pSStack_d0 = (*ppSVar6)->next;
          pSStack_d0 !=
          (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0; pSStack_d0 = pSStack_d0->next) {
        pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&bottom_it,&pSStack_d0->val);
        it._0_4_ = *pmVar5;
        for (local_d4 = 1; local_d4 < (mapped_type)it - it._4_4_; local_d4 = local_d4 + 1) {
          std::operator<<(out,"----");
        }
        poVar4 = std::operator<<(out,"-");
        i_1._3_1_ = std::setfill<char>('-');
        poVar4 = std::operator<<(poVar4,i_1._3_1_);
        local_dc = (int)std::setw(3);
        poVar4 = std::operator<<(poVar4,(_Setw)local_dc);
        std::ostream::operator<<(poVar4,pSStack_d0->val);
        it._4_4_ = (mapped_type)it;
      }
      it._0_4_ = __range2._4_4_;
      for (local_e0 = 1; local_e0 < (mapped_type)it - it._4_4_; local_e0 = local_e0 + 1) {
        std::operator<<(out,"----");
      }
      std::operator<<(out,"-E");
      std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*const_*,_std::vector<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>_>_>
      ::operator++(&local_e8,(int)&end);
    }
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &bottom_it);
    out_local = out;
  }
  return out_local;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const skiplist<T, V, X>& sl) {
    if (sl.key.empty()) {
        return out << "EMPTY SKIPLIST" << std::endl;
    }

    out << "Values: ";
    // store mapping of node->index in a map
    std::map<T, int> index_store{};
    auto bottom_it = (*(sl.key.begin()))->next;
    int cur_index = 0;
    while (bottom_it) {
        for (auto value : bottom_it->valz) {
          out << value << ", ";
        }

        index_store[bottom_it->val] = cur_index;
        cur_index++;
        bottom_it = bottom_it->next;
    }
    out << std::endl;

    auto level = sl.key.rbegin();
    auto end = sl.key.rend();
    while(level != end) {
        // S denotes start of level, could be something different
        out << "S";

        // to store previous element's index
        // and current element's index
        int index = -1, next_index;
        // skip the first element - it is always 0
        auto it = (*level)->next;
        // iterate through the list at this level
        while (it) {
            next_index = index_store[it->val];

            // filler to align it correctly
            // when elements in between don't exist at this level
            for (int i = 1; i < next_index - index; ++i) {
                out << "----";
            }

            // width of printed element is hardcoded to 3 for now
            // the padding is filled with ""-"
            out << "-" << std::setfill('-') << std::setw(3) << it->val;
            it = it->next;

            index = next_index;
        }
        next_index = cur_index;

        for (int i = 1; i < next_index - index; ++i) {
            out << "----";
        }

        out << "-E";

        out << std::endl;

        level++;
    }

    return out;
}